

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

Ivy_Obj_t ** Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *pObj,Ivy_Obj_t *pFanout)

{
  long lVar1;
  uint __line;
  char *__function;
  char *__assertion;
  long lStack_10;
  
  if (((ulong)pObj & 1) == 0) {
    if (((ulong)pFanout & 1) == 0) {
      if (pFanout != (Ivy_Obj_t *)0x0) {
        if ((Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pObj) {
          lStack_10 = 0x38;
        }
        else {
          if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pObj) {
            __assertion = "Ivy_ObjFanin1(pFanout) == pObj";
            __function = "Ivy_Obj_t *Ivy_ObjPrevFanout(Ivy_Obj_t *, Ivy_Obj_t *)";
            __line = 0x34;
            goto LAB_00650807;
          }
          lStack_10 = 0x40;
        }
        lVar1 = *(long *)((long)&pFanout->Id + lStack_10);
        if (lVar1 != 0) {
          if ((Ivy_Obj_t *)(*(ulong *)(lVar1 + 0x10) & 0xfffffffffffffffe) == pObj) {
            return (Ivy_Obj_t **)(lVar1 + 0x28);
          }
          if ((Ivy_Obj_t *)(*(ulong *)(lVar1 + 0x18) & 0xfffffffffffffffe) == pObj) {
            return (Ivy_Obj_t **)(lVar1 + 0x30);
          }
          __assertion = "Ivy_ObjFanin1(pTemp) == pObj";
          __function = "Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)";
          __line = 0x59;
          goto LAB_00650807;
        }
      }
      return &pObj->pFanout;
    }
    __assertion = "!Ivy_IsComplement(pFanout)";
    __function = "Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)";
    __line = 0x53;
  }
  else {
    __assertion = "!Ivy_IsComplement(pObj)";
    __function = "Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)";
    __line = 0x52;
  }
LAB_00650807:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                ,__line,__function);
}

Assistant:

static inline Ivy_Obj_t ** Ivy_ObjPrevNextFanoutPlace( Ivy_Obj_t * pObj, Ivy_Obj_t * pFanout )
{
    Ivy_Obj_t * pTemp;
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_IsComplement(pFanout) );
    pTemp = Ivy_ObjPrevFanout(pObj, pFanout);
    if ( pTemp == NULL )
        return &pObj->pFanout;
    if ( Ivy_ObjFanin0(pTemp) == pObj )
        return &pTemp->pNextFan0;
    assert( Ivy_ObjFanin1(pTemp) == pObj );
    return &pTemp->pNextFan1;
}